

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign_inner
              (secp256k1_context *ctx,secp256k1_scalar *r,secp256k1_scalar *s,int *recid,
              uchar *msg32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  secp256k1_scalar *bin;
  secp256k1_scalar *psVar8;
  code *pcVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int is_nonce_valid;
  unsigned_long _zzq_args [6];
  secp256k1_scalar non;
  secp256k1_scalar msg;
  uchar nonce32 [32];
  secp256k1_scalar asStackY_180 [2];
  secp256k1_scalar *psStackY_130;
  undefined1 local_11c [16];
  uint local_10c;
  uint64_t local_108;
  secp256k1_scalar *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  secp256k1_scalar *local_d8;
  secp256k1_scalar *local_d0;
  uint *local_c8;
  uchar *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  secp256k1_scalar local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_b8._8_8_ = local_b8._0_8_;
  local_11c._0_4_ = 0;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
  s->d[2] = 0;
  s->d[3] = 0;
  s->d[0] = 0;
  s->d[1] = 0;
  if (recid != (int *)0x0) {
    *recid = 0;
  }
  pcVar9 = nonce_function_rfc6979;
  if (noncefp != (secp256k1_nonce_function)0x0) {
    pcVar9 = noncefp;
  }
  psStackY_130 = (secp256k1_scalar *)0x119be8;
  local_d8 = r;
  local_d0 = s;
  local_c8 = (uint *)recid;
  local_c0 = seckey;
  local_10c = secp256k1_scalar_set_b32_seckey(&local_78,seckey);
  local_98._0_4_ = local_10c ^ 1;
  psStackY_130 = (secp256k1_scalar *)0x119c06;
  secp256k1_scalar_verify(&secp256k1_scalar_one);
  local_108 = 0x4d430005;
  local_f8 = 0x20;
  local_f0 = 0;
  local_e8 = 0;
  local_e0 = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_b8._8_8_;
  local_b8 = auVar5 << 0x40;
  uVar1 = (long)(int)local_98._0_4_ - 1;
  local_78.d[0] = (ulong)(local_98._0_4_ & 1) | local_78.d[0] & uVar1;
  auVar2._8_8_ = local_78.d[2];
  auVar2._0_8_ = local_78.d[1];
  auVar13._8_4_ = (int)uVar1;
  auVar13._0_8_ = uVar1;
  auVar13._12_4_ = (int)(uVar1 >> 0x20);
  local_78.d[1] = SUB168(auVar13 & auVar2,0);
  local_78.d[2] = SUB168(auVar13 & auVar2,8);
  local_78.d[3] = local_78.d[3] & uVar1;
  psStackY_130 = (secp256k1_scalar *)0x119c88;
  local_100 = &local_78;
  secp256k1_scalar_verify(&local_78);
  psStackY_130 = (secp256k1_scalar *)0x119c95;
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_98,msg32,(int *)0x0);
  uVar10 = 0;
  do {
    bVar4 = false;
    psStackY_130 = (secp256k1_scalar *)0x119cbe;
    bin = (secp256k1_scalar *)msg32;
    iVar6 = (*pcVar9)((uchar *)local_58,msg32,local_c0,(uchar *)0x0,noncedata,uVar10);
    local_11c._0_4_ = ZEXT14(iVar6 != 0);
    if (iVar6 != 0) {
      psStackY_130 = (secp256k1_scalar *)0x119cd8;
      bin = (secp256k1_scalar *)local_58;
      local_11c._12_4_ =
           secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)local_b8,(uchar *)local_58);
      if (ctx->declassify != 0) {
        local_108 = 0x4d430002;
        local_100 = (secp256k1_scalar *)(local_11c + 0xc);
        local_f8 = 4;
        local_f0 = 0;
        local_e8 = 0;
        local_e0 = 0;
        local_11c._4_8_ = 0;
      }
      if (local_11c._12_4_ != 0) {
        psStackY_130 = (secp256k1_scalar *)0x119d1c;
        bin = local_d8;
        local_11c._0_4_ =
             secp256k1_ecdsa_sig_sign
                       (&ctx->ecmult_gen_ctx,local_d8,local_d0,&local_78,
                        (secp256k1_scalar *)local_98,(secp256k1_scalar *)local_b8,(int *)local_c8);
        if (ctx->declassify != 0) {
          local_108 = 0x4d430002;
          local_100 = (secp256k1_scalar *)local_11c;
          local_f8 = 4;
          local_f0 = 0;
          local_e8 = 0;
          local_e0 = 0;
          local_11c._4_8_ = 0;
        }
        if (local_11c._0_4_ != 0) {
          bVar4 = false;
          goto LAB_00119d3b;
        }
      }
      uVar10 = uVar10 + 1;
      bVar4 = true;
    }
LAB_00119d3b:
    if (!bVar4) {
      local_11c._0_4_ = local_11c._0_4_ & local_10c;
      local_58 = (undefined1  [16])0x0;
      local_48 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_88 = (undefined1  [16])0x0;
      local_b8 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      local_78.d[0] = 0;
      local_78.d[1] = 0;
      local_78.d[2] = 0;
      local_78.d[3] = 0;
      local_100 = &local_78;
      local_108 = 0x4d430001;
      local_f8 = 0x20;
      local_f0 = 0;
      local_e8 = 0;
      local_e0 = 0;
      local_11c._4_8_ = 0;
      local_11c._12_4_ = ZEXT14(local_11c._0_4_ == 0);
      psStackY_130 = (secp256k1_scalar *)0x119f6b;
      secp256k1_scalar_verify(&secp256k1_scalar_zero);
      local_108 = 0x4d430005;
      local_100 = local_d8;
      local_f8 = 0x20;
      local_f0 = 0;
      local_e8 = 0;
      local_e0 = 0;
      uVar1 = (ulong)((long)local_d8 << 3) >> 0x33;
      uVar3 = (((long)local_d8 << 3 | (ulong)local_d8 >> 0x3d) << 0xd | uVar1) >> 3;
      psVar8 = (secp256k1_scalar *)(uVar3 << 0x33 | (uVar1 << 0x3d | uVar3) >> 0xd);
      local_11c._4_8_ = 0;
      lVar7 = (long)(int)local_11c._12_4_ + -1;
      auVar11._8_4_ = (int)lVar7;
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar2 = *(undefined1 (*) [16])(psVar8->d + 2);
      *(undefined1 (*) [16])psVar8->d = *(undefined1 (*) [16])psVar8->d & auVar11;
      *(undefined1 (*) [16])(psVar8->d + 2) = auVar2 & auVar11;
      psStackY_130 = (secp256k1_scalar *)0x119fe5;
      secp256k1_scalar_verify(psVar8);
      local_11c._12_4_ = ZEXT14(local_11c._0_4_ == 0);
      psStackY_130 = (secp256k1_scalar *)0x119ffb;
      secp256k1_scalar_verify(&secp256k1_scalar_zero);
      local_108 = 0x4d430005;
      local_100 = local_d0;
      local_f8 = 0x20;
      local_f0 = 0;
      local_e8 = 0;
      local_e0 = 0;
      uVar1 = (ulong)((long)local_d0 << 3) >> 0x33;
      uVar3 = (((long)local_d0 << 3 | (ulong)local_d0 >> 0x3d) << 0xd | uVar1) >> 3;
      psVar8 = (secp256k1_scalar *)(uVar3 << 0x33 | (uVar1 << 0x3d | uVar3) >> 0xd);
      local_11c._4_8_ = 0;
      lVar7 = (long)(int)local_11c._12_4_ + -1;
      auVar12._8_4_ = (int)lVar7;
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar2 = *(undefined1 (*) [16])(psVar8->d + 2);
      *(undefined1 (*) [16])psVar8->d = *(undefined1 (*) [16])psVar8->d & auVar12;
      *(undefined1 (*) [16])(psVar8->d + 2) = auVar2 & auVar12;
      psStackY_130 = (secp256k1_scalar *)0x11a06c;
      secp256k1_scalar_verify(psVar8);
      if (local_c8 == (uint *)0x0) {
        return local_11c._0_4_;
      }
      local_108 = CONCAT44(local_108._4_4_,(uint)(local_11c._0_4_ == 0));
      if ((int)*local_c8 < 0) {
        psStackY_130 = (secp256k1_scalar *)secp256k1_ec_seckey_verify;
        secp256k1_ecdsa_sign_inner_cold_1();
        psStackY_130 = &secp256k1_scalar_zero;
        if (psVar8 == (secp256k1_scalar *)0x0) {
          secp256k1_ec_seckey_verify_cold_2();
        }
        else if (bin != (secp256k1_scalar *)0x0) {
          iVar6 = secp256k1_scalar_set_b32_seckey(asStackY_180,(uchar *)bin);
          return iVar6;
        }
        secp256k1_ec_seckey_verify_cold_1();
        return 0;
      }
      *local_c8 = (local_11c._0_4_ == 0) + 0x7fffffff & *local_c8;
      return local_11c._0_4_;
    }
  } while( true );
}

Assistant:

static int secp256k1_ecdsa_sign_inner(const secp256k1_context* ctx, secp256k1_scalar* r, secp256k1_scalar* s, int* recid, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar sec, non, msg;
    int ret = 0;
    int is_sec_valid;
    unsigned char nonce32[32];
    unsigned int count = 0;
    /* Default initialization here is important so we won't pass uninit values to the cmov in the end */
    *r = secp256k1_scalar_zero;
    *s = secp256k1_scalar_zero;
    if (recid) {
        *recid = 0;
    }
    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_default;
    }

    /* Fail if the secret key is invalid. */
    is_sec_valid = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_one, !is_sec_valid);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    while (1) {
        int is_nonce_valid;
        ret = !!noncefp(nonce32, msg32, seckey, NULL, (void*)noncedata, count);
        if (!ret) {
            break;
        }
        is_nonce_valid = secp256k1_scalar_set_b32_seckey(&non, nonce32);
        /* The nonce is still secret here, but it being invalid is less likely than 1:2^255. */
        secp256k1_declassify(ctx, &is_nonce_valid, sizeof(is_nonce_valid));
        if (is_nonce_valid) {
            ret = secp256k1_ecdsa_sig_sign(&ctx->ecmult_gen_ctx, r, s, &sec, &msg, &non, recid);
            /* The final signature is no longer a secret, nor is the fact that we were successful or not. */
            secp256k1_declassify(ctx, &ret, sizeof(ret));
            if (ret) {
                break;
            }
        }
        count++;
    }
    /* We don't want to declassify is_sec_valid and therefore the range of
     * seckey. As a result is_sec_valid is included in ret only after ret was
     * used as a branching variable. */
    ret &= is_sec_valid;
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&msg);
    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_cmov(r, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_cmov(s, &secp256k1_scalar_zero, !ret);
    if (recid) {
        const int zero = 0;
        secp256k1_int_cmov(recid, &zero, !ret);
    }
    return ret;
}